

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void update_mxcsr_status_x86_64(CPUX86State *env)

{
  uint uVar1;
  uint uVar2;
  int local_18;
  int rnd_type;
  uint32_t mxcsr;
  CPUX86State *env_local;
  
  uVar1 = env->mxcsr;
  uVar2 = uVar1 & 0x6000;
  if (uVar2 != 0) {
    if (uVar2 == 0x2000) {
      local_18 = 1;
      goto LAB_00521520;
    }
    if (uVar2 == 0x4000) {
      local_18 = 2;
      goto LAB_00521520;
    }
    if (uVar2 == 0x6000) {
      local_18 = 3;
      goto LAB_00521520;
    }
  }
  local_18 = 0;
LAB_00521520:
  set_float_rounding_mode(local_18,&env->sse_status);
  set_flush_inputs_to_zero((uVar1 & 0x40) != 0,&env->sse_status);
  set_flush_to_zero((uVar1 & 0x8000) != 0,&env->fp_status);
  return;
}

Assistant:

void update_mxcsr_status(CPUX86State *env)
{
    uint32_t mxcsr = env->mxcsr;
    int rnd_type;

    /* set rounding mode */
    switch (mxcsr & SSE_RC_MASK) {
    default:
    case SSE_RC_NEAR:
        rnd_type = float_round_nearest_even;
        break;
    case SSE_RC_DOWN:
        rnd_type = float_round_down;
        break;
    case SSE_RC_UP:
        rnd_type = float_round_up;
        break;
    case SSE_RC_CHOP:
        rnd_type = float_round_to_zero;
        break;
    }
    set_float_rounding_mode(rnd_type, &env->sse_status);

    /* set denormals are zero */
    set_flush_inputs_to_zero((mxcsr & SSE_DAZ) ? 1 : 0, &env->sse_status);

    /* set flush to zero */
    set_flush_to_zero((mxcsr & SSE_FZ) ? 1 : 0, &env->fp_status);
}